

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stream.cpp
# Opt level: O2

FileStream * __thiscall dpfb::streams::FileStream::operator=(FileStream *this,FileStream *other)

{
  if (this != other) {
    if ((FILE *)this->fp != (FILE *)0x0) {
      fclose((FILE *)this->fp);
    }
    this->fp = other->fp;
    other->fp = (FILE *)0x0;
  }
  return this;
}

Assistant:

FileStream& FileStream::operator=(FileStream&& other)
{
    if (this != &other) {
        Stream::operator=(std::move(other));

        if (fp)
            std::fclose(fp);

        fp = other.fp;
        other.fp = nullptr;
    }

    return *this;
}